

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testLargeDataWindowOffsets.cpp
# Opt level: O1

ChannelList *
anon_unknown.dwarf_306861::setupBuffer
          (ChannelList *__return_storage_ptr__,Header *hdr,char **channels,PixelType *pt,
          FrameBuffer *buf,bool writing)

{
  _Rb_tree_header *p_Var1;
  int iVar2;
  char *pcVar3;
  uint uVar4;
  Box2i *pBVar5;
  undefined8 *puVar6;
  long lVar7;
  PixelType t;
  long lVar8;
  undefined4 *puVar9;
  vector<char,_std::allocator<char>_> *this;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  void *ptr;
  long lVar14;
  undefined1 auVar15 [16];
  Vec2<int> local_78;
  Vec2<int> VStack_70;
  Slice local_68;
  
  pBVar5 = Imf_2_5::Header::dataWindow(hdr);
  local_78 = pBVar5->min;
  VStack_70 = pBVar5->max;
  lVar10 = -1;
  lVar14 = 4;
  do {
    lVar14 = lVar14 + -4;
    lVar8 = lVar10 + 1;
    lVar10 = lVar10 + 1;
  } while (channels[lVar8] != (char *)0x0);
  pBVar5 = Imf_2_5::Header::dataWindow(hdr);
  iVar2 = (pBVar5->max).x;
  pBVar5 = Imf_2_5::Header::dataWindow(hdr);
  lVar11 = (long)((iVar2 - (pBVar5->min).x) + 1);
  pBVar5 = Imf_2_5::Header::dataWindow(hdr);
  iVar2 = (pBVar5->max).y;
  pBVar5 = Imf_2_5::Header::dataWindow(hdr);
  lVar8 = (long)((iVar2 - (pBVar5->min).y) + 1);
  lVar12 = lVar10 * lVar11 * lVar8;
  this = (vector<char,_std::allocator<char>_> *)&(anonymous_namespace)::readingBuffer;
  if (writing) {
    this = (vector<char,_std::allocator<char>_> *)&(anonymous_namespace)::writingBuffer;
  }
  std::vector<char,_std::allocator<char>_>::resize(this,lVar12 * 4);
  if (lVar12 != 0) {
    puVar6 = &(anonymous_namespace)::readingBuffer;
    if (writing) {
      puVar6 = &(anonymous_namespace)::writingBuffer;
    }
    puVar9 = (undefined4 *)*puVar6;
    lVar12 = 0;
    lVar13 = 0;
LAB_001a87de:
    do {
      uVar4 = random_int(0xffff);
      if ((~uVar4 & 0x7c00) == 0) {
        if ((uVar4 & 0x3ff) != 0) goto LAB_001a87de;
      }
      if ((pt == (PixelType *)0x0) || (pt[lVar12] == HALF)) {
        *(short *)puVar9 = (short)uVar4;
      }
      else {
        *puVar9 = *(undefined4 *)((long)&half::_toFloat + (ulong)(uVar4 & 0xffff) * 4);
      }
      lVar7 = lVar10 - lVar12;
      lVar12 = lVar12 + 1;
      puVar9 = puVar9 + 1;
      if (lVar7 == 1) {
        lVar12 = 0;
      }
      lVar13 = lVar13 + 1;
    } while (lVar13 != lVar11 * lVar8 * lVar10);
  }
  p_Var1 = &(__return_storage_ptr__->_map)._M_t._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (__return_storage_ptr__->_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_map)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  if (lVar10 != 0) {
    lVar8 = (long)((VStack_70.x - local_78.x) + 1);
    puVar6 = &(anonymous_namespace)::readingBuffer;
    if (writing) {
      puVar6 = &(anonymous_namespace)::writingBuffer;
    }
    ptr = (void *)*puVar6;
    lVar11 = 0;
    do {
      t = HALF;
      if (pt != (PixelType *)0x0) {
        t = pt[lVar11];
      }
      pcVar3 = channels[lVar11];
      Imf_2_5::Channel::Channel((Channel *)&local_68,t,1,1,false);
      Imf_2_5::ChannelList::insert(__return_storage_ptr__,pcVar3,(Channel *)&local_68);
      pcVar3 = channels[lVar11];
      auVar15._8_4_ = (int)((ulong)lVar11 >> 0x20);
      auVar15._0_8_ = lVar11;
      auVar15._12_4_ = 0x45300000;
      Imf_2_5::Slice::Make
                (&local_68,t,ptr,&local_78,lVar8,1,-lVar14,-lVar14 * lVar8,1,1,
                 (auVar15._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)lVar11) - 4503599627370496.0) + 100.0,false,false
                );
      Imf_2_5::FrameBuffer::insert(buf,pcVar3,&local_68);
      ptr = (void *)((long)ptr + 4);
      lVar11 = lVar11 + 1;
    } while (lVar10 != lVar11);
  }
  return __return_storage_ptr__;
}

Assistant:

ChannelList
setupBuffer (const Header& hdr,       // header to grab datawindow from
             const char * const *channels, // NULL terminated list of channels to write
             const PixelType *pt,
             FrameBuffer& buf,        // buffer to fill with pointers to channel
             bool writing                  // true if should allocate
            )
{
    Box2i dw = hdr.dataWindow();

    //
    // how many channels in total
    //
    size_t activechans = 0;
    
    while (channels[activechans]!=NULL)
    {
        activechans++;
    }

    size_t samples = size_t(hdr.dataWindow().max.x+1-hdr.dataWindow().min.x)*
                  size_t(hdr.dataWindow().max.y+1-hdr.dataWindow().min.y)*activechans;

    // always allocate four bytes for each sample, even half types. to keep floats word-aligned
    size_t size =samples * 4;

    
    if (writing)
    {
        writingBuffer.resize(size);
    }
    else
    {
        readingBuffer.resize(size);
    }
   
     const char * write_ptr = writing ? &writingBuffer[0] : &readingBuffer[0];
     // fill with random halfs, casting to floats for float channels - don't write NaN values
     size_t chan=0;
     for (size_t i=0;i<samples;i++)
     {

         half v;
         do
         {
           unsigned short int values = random_int(std::numeric_limits<unsigned short>::max());
           v.setBits(values);
         }
         while ( v.isNan() );

         if (pt==NULL || pt[chan]==IMF::HALF)
         {
             *(half*)write_ptr = half(v);
         }
         else
         {
             *(float*)write_ptr = float(v);
         }
         chan++;
         write_ptr += 4;
         if (chan==activechans)
         {
             chan=0;
         }
        
     }

     

    ChannelList chanlist;

    int64_t width = (dw.max.x+1-dw.min.x);
    int64_t bytes_per_row = activechans * 4 * width;
   
    const char* offset = ( writing ? writingBuffer.data() : readingBuffer.data() ); 
    for (size_t i=0;i<activechans;i++)
    {
        PixelType type = pt==NULL ? IMF::HALF : pt[i];

        chanlist.insert(channels[i],type);
        buf.insert (channels[i],
                    Slice::Make (type,
                                 offset,
                                 dw.min,
                                 width,1,
                                 activechans * 4,
                                 bytes_per_row,
                                 1,
                                 1,
                                 100.+i,false,false
                                )
                    );
        offset += 4;
   }

    return chanlist;
}